

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_replacex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_mut_val *new_val,yyjson_ptr_ctx *ctx,
          yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  bool bVar3;
  int iVar4;
  yyjson_mut_val *next;
  yyjson_mut_val *pyVar5;
  ulong uVar6;
  ulong uVar7;
  yyjson_ptr_ctx *pyVar8;
  yyjson_mut_val *pyVar9;
  yyjson_mut_val *pyVar10;
  ulong uVar11;
  ulong __n;
  yyjson_ptr_ctx *pyVar12;
  yyjson_mut_val *pyVar13;
  yyjson_ptr_ctx cur_ctx;
  yyjson_mut_val *local_80;
  yyjson_ptr_ctx local_48;
  
  local_48.ctn = (yyjson_mut_val *)0x0;
  local_48.pre = (yyjson_mut_val *)0x0;
  local_48.old = (yyjson_mut_val *)0x0;
  pyVar12 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar12 = &local_48;
  }
  pyVar5 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar12,err);
  if (pyVar5 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  pyVar12 = (yyjson_ptr_ctx *)pyVar12->ctn;
  if (pyVar12 != (yyjson_ptr_ctx *)0x0) {
    local_80 = pyVar12->ctn;
    pyVar8 = ctx;
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      pyVar8 = &local_48;
    }
    pyVar1 = pyVar8->pre;
    if ((~(uint)local_80 & 7) == 0) {
      pyVar1 = pyVar1->next->next;
      if ((pyVar1 != (yyjson_mut_val *)0x0) && (((uint)pyVar1->tag & 7) == 5)) {
        uVar11 = 0;
        pyVar9 = (yyjson_mut_val *)0x0;
        if ((yyjson_mut_val *)0xff < local_80) {
          uVar11 = (ulong)local_80 >> 8;
          pyVar9 = pyVar12->pre;
        }
        __n = pyVar1->tag >> 8;
        bVar3 = false;
        uVar6 = 0;
        while (uVar7 = uVar6, pyVar10 = pyVar9, uVar6 = uVar7 + 1, uVar7 < uVar11) {
          pyVar13 = pyVar10->next;
          pyVar9 = pyVar13->next;
          if (pyVar9 == (yyjson_mut_val *)0x0) break;
          if ((pyVar9->tag >> 8 == __n) &&
             (iVar4 = bcmp((pyVar9->uni).ptr,(pyVar1->uni).ptr,__n), iVar4 == 0)) {
            pyVar2 = pyVar9->next->next;
            if ((new_val == (yyjson_mut_val *)0x0) || (bVar3)) {
              if (uVar11 == uVar6) {
                pyVar12->pre = pyVar10;
                pyVar13 = pyVar10->next;
              }
              uVar11 = uVar11 - 1;
              local_80 = (yyjson_mut_val *)(uVar11 * 0x100 | (ulong)local_80 & 0xff);
              pyVar12->ctn = local_80;
              pyVar13->next = pyVar2;
              pyVar9 = pyVar10;
              uVar6 = uVar7;
            }
            else {
              new_val->next = pyVar2;
              pyVar9->next = new_val;
              bVar3 = true;
            }
          }
        }
        if (new_val != (yyjson_mut_val *)0x0 && !bVar3) {
          pyVar9 = pyVar1;
          if (uVar11 != 0) {
            pyVar10 = pyVar12->pre->next;
            pyVar9 = pyVar10->next;
            pyVar10->next = pyVar1;
          }
          new_val->next = pyVar9;
          pyVar1->next = new_val;
          pyVar12->pre = pyVar1;
          pyVar12->ctn = (yyjson_mut_val *)(((ulong)local_80 & 0xff) + uVar11 * 0x100 + 0x100);
        }
      }
    }
    else if (new_val != (yyjson_mut_val *)0x0 && pyVar1 != (yyjson_mut_val *)0x0) {
      pyVar9 = pyVar1->next;
      if (pyVar1 == pyVar9) {
        new_val->next = new_val;
        pyVar12->pre = new_val;
        pyVar12 = pyVar8;
      }
      else {
        new_val->next = pyVar9->next;
        pyVar1->next = new_val;
        if (pyVar12->pre != pyVar9) goto LAB_01b8beeb;
      }
      pyVar12->pre = new_val;
    }
  }
LAB_01b8beeb:
  pyVar12 = &local_48;
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    pyVar12 = ctx;
  }
  pyVar12->old = pyVar5;
  return pyVar5;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_replacex(
    yyjson_mut_val *val, const char *ptr, size_t len, yyjson_mut_val *new_val,
    yyjson_ptr_ctx *ctx, yyjson_ptr_err *err) {

    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (!cur_val) return NULL;

    if (yyjson_mut_is_obj(ctx->ctn)) {
        yyjson_mut_val *key = ctx->pre->next->next;
        yyjson_mut_obj_put(ctx->ctn, key, new_val);
    } else {
        yyjson_ptr_ctx_replace(ctx, new_val);
    }
    ctx->old = cur_val;
    return cur_val;
}